

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O0

string * __thiscall
gl3cts::ClipDistance::FunctionalTest::prepareVertexShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,FunctionalTest *this,bool explicit_redeclaration,
          bool dynamic_setter,GLuint clip_count,GLuint clip_function,GLenum primitive_type)

{
  char *__s;
  GLchar *pGVar1;
  GLint i_00;
  GLint i_01;
  allocator<char> local_609;
  string local_608;
  allocator<char> local_5e1;
  string local_5e0;
  string local_5c0;
  string local_5a0;
  allocator<char> local_579;
  string local_578;
  allocator<char> local_551;
  string local_550;
  string local_530;
  string local_510;
  allocator<char> local_4e9;
  string local_4e8;
  allocator<char> local_4c1;
  string local_4c0;
  string local_4a0;
  string local_480;
  string local_460;
  allocator<char> local_439;
  string local_438;
  string local_418;
  string local_3f8;
  allocator<char> local_3d1;
  string local_3d0;
  allocator<char> local_3a9;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  allocator<char> local_321;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  string local_278;
  string local_258;
  allocator<char> local_231;
  string local_230 [8];
  string i_setter;
  GLuint i;
  string static_setters;
  string local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  string local_198;
  string local_178;
  allocator<char> local_151;
  string local_150;
  allocator<char> local_129;
  string local_128;
  string local_108;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  string local_78;
  string local_58;
  allocator<char> local_26;
  undefined1 local_25;
  GLuint local_24;
  GLuint local_20;
  GLuint clip_function_local;
  GLuint clip_count_local;
  bool dynamic_setter_local;
  bool explicit_redeclaration_local;
  FunctionalTest *this_local;
  string *vertex_shader;
  
  pGVar1 = m_vertex_shader_code;
  local_25 = 0;
  local_24 = clip_function;
  local_20 = clip_count;
  clip_function_local._2_1_ = dynamic_setter;
  clip_function_local._3_1_ = explicit_redeclaration;
  _clip_count_local = this;
  this_local = (FunctionalTest *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,pGVar1,&local_26);
  std::allocator<char>::~allocator(&local_26);
  if ((clip_function_local._3_1_ & 1) == 0) {
    std::__cxx11::string::string((string *)&local_108,(string *)__return_storage_ptr__);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,"CLIP_DISTANCE_REDECLARATION",&local_129);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"",&local_151);
    Utility::preprocessCode(&local_e8,&local_108,&local_128,&local_150);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator(&local_151);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator(&local_129);
    std::__cxx11::string::~string((string *)&local_108);
  }
  else {
    std::__cxx11::string::string((string *)&local_78,(string *)__return_storage_ptr__);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"CLIP_DISTANCE_REDECLARATION",&local_99);
    pGVar1 = m_explicit_redeclaration;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,pGVar1,&local_c1);
    Utility::preprocessCode(&local_58,&local_78,&local_98,&local_c0);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
    std::__cxx11::string::~string((string *)&local_78);
  }
  if ((clip_function_local._2_1_ & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&i,"",(allocator<char> *)(i_setter.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(i_setter.field_2._M_local_buf + 0xf));
    for (i_setter.field_2._8_4_ = 0; pGVar1 = m_static_array_setter,
        (uint)i_setter.field_2._8_4_ < local_20; i_setter.field_2._8_4_ = i_setter.field_2._8_4_ + 1
        ) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_230,pGVar1,&local_231);
      std::allocator<char>::~allocator(&local_231);
      std::__cxx11::string::string((string *)&local_278,local_230);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_298,"CLIP_INDEX",&local_299);
      Utility::itoa_abi_cxx11_(&local_2c0,(Utility *)(ulong)(uint)i_setter.field_2._8_4_,i_00);
      Utility::preprocessCode(&local_258,&local_278,&local_298,&local_2c0);
      std::__cxx11::string::operator=(local_230,(string *)&local_258);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::__cxx11::string::~string((string *)&local_298);
      std::allocator<char>::~allocator(&local_299);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::append((string *)&i);
      std::__cxx11::string::~string(local_230);
    }
    std::__cxx11::string::string((string *)&local_300,(string *)__return_storage_ptr__);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_320,"CLIP_DISTANCE_SETUP",&local_321);
    std::__cxx11::string::string((string *)&local_348,(string *)&i);
    Utility::preprocessCode(&local_2e0,&local_300,&local_320,&local_348);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_320);
    std::allocator<char>::~allocator(&local_321);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&i);
  }
  else {
    std::__cxx11::string::string((string *)&local_198,(string *)__return_storage_ptr__);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b8,"CLIP_DISTANCE_SETUP",&local_1b9);
    pGVar1 = m_dynamic_array_setter;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,pGVar1,
               (allocator<char> *)(static_setters.field_2._M_local_buf + 0xf));
    Utility::preprocessCode(&local_178,&local_198,&local_1b8,&local_1e0);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator((allocator<char> *)(static_setters.field_2._M_local_buf + 0xf))
    ;
    std::__cxx11::string::~string((string *)&local_1b8);
    std::allocator<char>::~allocator(&local_1b9);
    std::__cxx11::string::~string((string *)&local_198);
  }
  std::__cxx11::string::string((string *)&local_388,(string *)__return_storage_ptr__);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a8,"CLIP_FUNCTION",&local_3a9);
  __s = m_clip_function[local_24];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,__s,&local_3d1);
  Utility::preprocessCode(&local_368,&local_388,&local_3a8,&local_3d0);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_368);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::allocator<char>::~allocator(&local_3d1);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::allocator<char>::~allocator(&local_3a9);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::string((string *)&local_418,(string *)__return_storage_ptr__);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_438,"CLIP_COUNT",&local_439);
  Utility::itoa_abi_cxx11_(&local_460,(Utility *)(ulong)local_20,i_01);
  Utility::preprocessCode(&local_3f8,&local_418,&local_438,&local_460);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_3f8);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_438);
  std::allocator<char>::~allocator(&local_439);
  std::__cxx11::string::~string((string *)&local_418);
  if (primitive_type == 0) {
    std::__cxx11::string::string((string *)&local_4a0,(string *)__return_storage_ptr__);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4c0,"VERTEX_COUNT",&local_4c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e8,"1",&local_4e9);
    Utility::preprocessCode(&local_480,&local_4a0,&local_4c0,&local_4e8);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_480);
    std::__cxx11::string::~string((string *)&local_480);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::allocator<char>::~allocator(&local_4e9);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::allocator<char>::~allocator(&local_4c1);
    std::__cxx11::string::~string((string *)&local_4a0);
  }
  else if (primitive_type == 1) {
    std::__cxx11::string::string((string *)&local_530,(string *)__return_storage_ptr__);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_550,"VERTEX_COUNT",&local_551);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_578,"2",&local_579);
    Utility::preprocessCode(&local_510,&local_530,&local_550,&local_578);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_510);
    std::__cxx11::string::~string((string *)&local_510);
    std::__cxx11::string::~string((string *)&local_578);
    std::allocator<char>::~allocator(&local_579);
    std::__cxx11::string::~string((string *)&local_550);
    std::allocator<char>::~allocator(&local_551);
    std::__cxx11::string::~string((string *)&local_530);
  }
  else if (primitive_type == 4) {
    std::__cxx11::string::string((string *)&local_5c0,(string *)__return_storage_ptr__);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5e0,"VERTEX_COUNT",&local_5e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_608,"3",&local_609);
    Utility::preprocessCode(&local_5a0,&local_5c0,&local_5e0,&local_608);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_5a0);
    std::__cxx11::string::~string((string *)&local_5a0);
    std::__cxx11::string::~string((string *)&local_608);
    std::allocator<char>::~allocator(&local_609);
    std::__cxx11::string::~string((string *)&local_5e0);
    std::allocator<char>::~allocator(&local_5e1);
    std::__cxx11::string::~string((string *)&local_5c0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string gl3cts::ClipDistance::FunctionalTest::prepareVertexShaderCode(bool explicit_redeclaration,
																		  bool dynamic_setter, glw::GLuint clip_count,
																		  glw::GLuint clip_function,
																		  glw::GLenum primitive_type)
{
	std::string vertex_shader = m_vertex_shader_code;

	if (explicit_redeclaration)
	{
		vertex_shader = gl3cts::ClipDistance::Utility::preprocessCode(vertex_shader, "CLIP_DISTANCE_REDECLARATION",
																	  m_explicit_redeclaration);
	}
	else
	{
		vertex_shader = gl3cts::ClipDistance::Utility::preprocessCode(vertex_shader, "CLIP_DISTANCE_REDECLARATION", "");
	}

	if (dynamic_setter)
	{
		vertex_shader =
			gl3cts::ClipDistance::Utility::preprocessCode(vertex_shader, "CLIP_DISTANCE_SETUP", m_dynamic_array_setter);
	}
	else
	{
		std::string static_setters = "";

		for (glw::GLuint i = 0; i < clip_count; ++i)
		{
			std::string i_setter = m_static_array_setter;

			i_setter = gl3cts::ClipDistance::Utility::preprocessCode(i_setter, "CLIP_INDEX",
																	 gl3cts::ClipDistance::Utility::itoa(i));

			static_setters.append(i_setter);
		}

		vertex_shader =
			gl3cts::ClipDistance::Utility::preprocessCode(vertex_shader, "CLIP_DISTANCE_SETUP", static_setters);
	}

	vertex_shader =
		gl3cts::ClipDistance::Utility::preprocessCode(vertex_shader, "CLIP_FUNCTION", m_clip_function[clip_function]);

	vertex_shader = gl3cts::ClipDistance::Utility::preprocessCode(vertex_shader, "CLIP_COUNT",
																  gl3cts::ClipDistance::Utility::itoa(clip_count));

	switch (primitive_type)
	{
	case GL_POINTS:
		vertex_shader = gl3cts::ClipDistance::Utility::preprocessCode(vertex_shader, "VERTEX_COUNT", "1");
		break;
	case GL_LINES:
		vertex_shader = gl3cts::ClipDistance::Utility::preprocessCode(vertex_shader, "VERTEX_COUNT", "2");
		break;
	case GL_TRIANGLES:
		vertex_shader = gl3cts::ClipDistance::Utility::preprocessCode(vertex_shader, "VERTEX_COUNT", "3");
		break;
	}

	return vertex_shader;
}